

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool __thiscall
cmStringCommand::RegexMatch
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *delimiter;
  pointer pbVar1;
  bool bVar2;
  string output;
  string input;
  string e_1;
  RegularExpression re;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  RegularExpression local_f8;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  cmMakefile::ClearMatches((this->super_cmCommand).Makefile);
  local_f8.regmatch.startp[0] = (char *)0x0;
  local_f8.regmatch.endp[0] = (char *)0x0;
  local_f8.regmatch.searchstring = (char *)0x0;
  local_f8.program = (char *)0x0;
  bVar2 = cmsys::RegularExpression::compile(&local_f8,pbVar1[2]._M_dataplus._M_p);
  if (!bVar2) {
    std::operator+(&local_178,"sub-command REGEX, mode MATCH failed to compile regex \"",pbVar1 + 2)
    ;
    std::operator+(&local_158,&local_178,"\".");
    std::__cxx11::string::~string((string *)&local_178);
    cmCommand::SetError(&this->super_cmCommand,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    bVar2 = false;
    goto LAB_0023e3da;
  }
  local_138._M_string_length =
       (size_type)
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_138._M_dataplus._M_p =
       (pointer)((args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 4);
  delimiter = &local_178.field_2;
  local_178._M_string_length = 0;
  local_178.field_2._M_local_buf[0] = '\0';
  local_178._M_dataplus._M_p = (pointer)delimiter;
  cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            (&local_158,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&local_138,delimiter->_M_local_buf);
  std::__cxx11::string::~string((string *)&local_178);
  local_178._M_string_length = 0;
  local_178.field_2._M_local_buf[0] = '\0';
  local_178._M_dataplus._M_p = (pointer)delimiter;
  bVar2 = cmsys::RegularExpression::find(&local_f8,local_158._M_dataplus._M_p);
  if (bVar2) {
    cmMakefile::StoreMatches((this->super_cmCommand).Makefile,&local_f8);
    if (local_f8.regmatch.endp[0] != local_f8.regmatch.startp[0]) {
      std::__cxx11::string::substr((ulong)&local_138,(ulong)&local_158);
      std::__cxx11::string::operator=((string *)&local_178,(string *)&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      goto LAB_0023e369;
    }
    std::operator+(&local_118,"sub-command REGEX, mode MATCH regex \"",pbVar1 + 2);
    std::operator+(&local_138,&local_118,"\" matched an empty string.");
    std::__cxx11::string::~string((string *)&local_118);
    cmCommand::SetError(&this->super_cmCommand,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    bVar2 = false;
  }
  else {
LAB_0023e369:
    bVar2 = true;
    cmMakefile::AddDefinition
              ((this->super_cmCommand).Makefile,pbVar1 + 3,local_178._M_dataplus._M_p);
  }
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
LAB_0023e3da:
  cmsys::RegularExpression::~RegularExpression(&local_f8);
  return bVar2;
}

Assistant:

bool cmStringCommand::RegexMatch(std::vector<std::string> const& args)
{
  //"STRING(REGEX MATCH <regular_expression> <output variable>
  // <input> [<input>...])\n";
  std::string const& regex = args[2];
  std::string const& outvar = args[3];

  this->Makefile->ClearMatches();
  // Compile the regular expression.
  cmsys::RegularExpression re;
  if (!re.compile(regex.c_str())) {
    std::string e =
      "sub-command REGEX, mode MATCH failed to compile regex \"" + regex +
      "\".";
    this->SetError(e);
    return false;
  }

  // Concatenate all the last arguments together.
  std::string input = cmJoin(cmMakeRange(args).advance(4), std::string());

  // Scan through the input for all matches.
  std::string output;
  if (re.find(input)) {
    this->Makefile->StoreMatches(re);
    std::string::size_type l = re.start();
    std::string::size_type r = re.end();
    if (r - l == 0) {
      std::string e = "sub-command REGEX, mode MATCH regex \"" + regex +
        "\" matched an empty string.";
      this->SetError(e);
      return false;
    }
    output = input.substr(l, r - l);
  }

  // Store the output in the provided variable.
  this->Makefile->AddDefinition(outvar, output.c_str());
  return true;
}